

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall slang::ast::Compilation::Compilation(Compilation *this,Bag *options)

{
  PropertyType *pPVar1;
  SequenceType *pSVar2;
  UntypedType *pUVar3;
  TypeRefType *pTVar4;
  UnboundedType *pUVar5;
  EventType *pEVar6;
  NullType *pNVar7;
  ScalarType *pSVar8;
  PredefinedIntegerType *pPVar9;
  FloatingType *pFVar10;
  Type *pTVar11;
  Type **ppTVar12;
  unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *puVar13;
  unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *puVar14;
  pointer pNVar15;
  PackageSymbol *pPVar16;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_bool>
  pVar17;
  Type **local_408;
  anon_class_1_0_00000001 local_3c9;
  unique_ptr<slang::ast::TypeArgFormatter,_std::default_delete<slang::ast::TypeArgFormatter>_>
  local_3c8;
  shared_ptr<slang::DiagArgFormatter> local_3c0;
  EntryPointer local_3b0;
  undefined1 local_3a8;
  undefined1 local_3a0 [12];
  TimeScaleValue local_394;
  TimeScaleValue local_392;
  Compilation *local_390;
  anon_class_8_1_8991fb9c registerScalar;
  unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> local_380;
  TokenKind local_372;
  string_view local_370;
  basic_string_view<char,_std::char_traits<char>_> local_35c;
  TokenKind local_34a;
  string_view local_348;
  basic_string_view<char,_std::char_traits<char>_> local_334;
  TokenKind local_322;
  string_view local_320;
  basic_string_view<char,_std::char_traits<char>_> local_30c;
  TokenKind local_2fa;
  string_view local_2f8;
  basic_string_view<char,_std::char_traits<char>_> local_2e4;
  TokenKind local_2d2;
  string_view local_2d0;
  basic_string_view<char,_std::char_traits<char>_> local_2bc;
  TokenKind local_2aa;
  string_view local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_294;
  TokenKind local_282;
  string_view local_280;
  basic_string_view<char,_std::char_traits<char>_> local_26c;
  TokenKind local_25a;
  string_view local_258;
  basic_string_view<char,_std::char_traits<char>_> local_244;
  TokenKind local_232;
  string_view local_230;
  basic_string_view<char,_std::char_traits<char>_> local_21c;
  TokenKind local_20a;
  string_view local_208;
  basic_string_view<char,_std::char_traits<char>_> local_1f4;
  TokenKind local_1e2;
  string_view local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1cc;
  TokenKind local_1ba;
  string_view local_1b8;
  basic_string_view<char,_std::char_traits<char>_> local_1a4;
  TokenKind local_192;
  string_view local_190;
  basic_string_view<char,_std::char_traits<char>_> local_17c;
  float local_16c;
  SyntaxKind local_168 [7];
  float local_14c;
  SyntaxKind local_148 [7];
  float local_12c;
  SyntaxKind local_128 [6];
  Type *local_110;
  PropertyType *propertyType;
  SequenceType *sequenceType;
  UntypedType *untypedType;
  TypeRefType *typeRefType;
  UnboundedType *unboundedType;
  EventType *eventType;
  NullType *nullType;
  CHandleType *chandleType;
  FloatingType *local_c8;
  FloatingType *realTimeType;
  PredefinedIntegerType *local_b8;
  PredefinedIntegerType *timeType;
  PredefinedIntegerType *local_a8;
  PredefinedIntegerType *longIntType;
  PredefinedIntegerType *local_98;
  PredefinedIntegerType *shortIntType;
  ScalarType *local_88;
  ScalarType *signedRegType;
  ScalarType *local_78;
  ScalarType *signedLogicType;
  ScalarType *local_68;
  ScalarType *signedBitType;
  ScalarType *local_58;
  ScalarType *regType;
  Kind local_48;
  Kind local_44 [3];
  Kind local_38 [2];
  SourceLocation local_30;
  DiagCode local_28 [4];
  Bag *local_18;
  Bag *options_local;
  Compilation *this_local;
  
  local_18 = options;
  options_local = (Bag *)this;
  BumpAllocator::BumpAllocator(&this->super_BumpAllocator);
  Bag::getOrDefault<slang::ast::CompilationOptions>(&this->options,local_18);
  TypedBumpAllocator<ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  ::TypedBumpAllocator(&this->symbolMapAllocator);
  TypedBumpAllocator<ska::flat_hash_map<unsigned_long,_unsigned_long,_slang::Hasher<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::TypedBumpAllocator(&this->pointerMapAllocator);
  TypedBumpAllocator<slang::ConstantValue>::TypedBumpAllocator(&this->constantAllocator);
  TypedBumpAllocator<slang::ast::GenericClassDefSymbol>::TypedBumpAllocator
            (&this->genericClassAllocator);
  this->scalarTypeTable[0] = (Type *)0x0;
  local_408 = this->scalarTypeTable + 1;
  do {
    *local_408 = (Type *)0x0;
    local_408 = local_408 + 1;
  } while (local_408 != &this->bitType);
  SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>::
  SafeIndexedVector(&this->deferredData);
  SafeIndexedVector<std::vector<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>,_slang::ast::Scope::ImportDataIndex>
  ::SafeIndexedVector(&this->importData);
  ska::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>
  ::flat_hash_map(&this->topDefinitions);
  ska::
  flat_hash_map<unsigned_int,_const_slang::ast::Type_*,_slang::Hasher<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<unsigned_int,_const_slang::ast::Type_*>_>_>
  ::flat_hash_map(&this->vectorTypeCache);
  ska::
  flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  ::flat_hash_map(&this->knownTypes);
  ska::
  flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
  ::flat_hash_map(&this->knownNetTypes);
  ska::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
  ::flat_hash_map(&this->packageMap);
  ska::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SystemSubroutine_*>_>_>
  ::flat_hash_map(&this->subroutineMap);
  ska::
  flat_hash_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_const_slang::ast::SystemSubroutine_*>_>_>
  ::flat_hash_map(&this->methodMap);
  ska::
  flat_hash_map<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>,_slang::Hasher<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*,_nonstd::span_lite::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
  ::flat_hash_map(&this->attributeMap);
  ska::
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::flat_hash_set(&this->globalInstantiations);
  ska::
  flat_hash_map<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>
  ::flat_hash_map(&this->definitionMetadata);
  ska::
  flat_hash_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>
  ::flat_hash_map(&this->definitionMap);
  ska::
  flat_hash_map<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
  ::flat_hash_map(&this->diagMap);
  ska::
  flat_hash_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  ::flat_hash_map(&this->outOfBlockDecls);
  std::unique_ptr<slang::ast::RootSymbol,std::default_delete<slang::ast::RootSymbol>>::
  unique_ptr<std::default_delete<slang::ast::RootSymbol>,void>
            ((unique_ptr<slang::ast::RootSymbol,std::default_delete<slang::ast::RootSymbol>> *)
             &this->root);
  this->sourceManager = (SourceManager *)0x0;
  this->numErrors = 0;
  TimeScale::TimeScale(&this->defaultTimeScale);
  this->finalized = false;
  this->finalizing = false;
  this->typoCorrections = 0;
  this->nextEnumSystemId = 1;
  this->nextStructSystemId = 1;
  this->nextUnionSystemId = 1;
  DiagCode::DiagCode(local_28);
  SourceLocation::SourceLocation(&local_30);
  Diagnostic::Diagnostic(&this->tempDiag,local_28[0],local_30);
  std::optional<slang::Diagnostics>::optional(&this->cachedParseDiagnostics);
  std::optional<slang::Diagnostics>::optional(&this->cachedSemanticDiagnostics);
  std::optional<slang::Diagnostics>::optional(&this->cachedAllDiagnostics);
  std::
  vector<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ::vector(&this->compilationUnits);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::vector(&this->syntaxTrees);
  std::vector<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>::
  vector(&this->unreferencedDefs);
  ska::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  ::flat_hash_map(&this->udpMap);
  ska::
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  ::flat_hash_map(&this->gateMap);
  ska::
  flat_hash_map<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>,_slang::Hasher<const_slang::ast::Definition_*>,_std::equal_to<const_slang::ast::Definition_*>,_std::allocator<std::pair<const_slang::ast::Definition_*,_std::vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>_>_>_>
  ::flat_hash_map(&this->bindDirectivesByDef);
  ska::
  flat_hash_set<const_slang::syntax::BindDirectiveSyntax_*,_slang::Hasher<const_slang::syntax::BindDirectiveSyntax_*>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
  ::flat_hash_set(&this->seenBindDirectives);
  ParamOverrideNode::ParamOverrideNode(&this->paramOverrides);
  std::
  vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ::vector(&this->dpiExports);
  ska::
  flat_hash_map<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>,_slang::Hasher<const_slang::ast::PackageSymbol_*>,_std::equal_to<const_slang::ast::PackageSymbol_*>,_std::allocator<std::pair<const_slang::ast::PackageSymbol_*,_ska::flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>_>_>
  ::flat_hash_map(&this->packageExportCandidateMap);
  std::
  vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  ::vector(&this->externInterfaceMethods);
  std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::vector
            (&this->nameConflicts);
  ska::
  flat_hash_map<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>
  ::flat_hash_map(&this->defaultClockingMap);
  ska::
  flat_hash_map<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>_>_>
  ::flat_hash_map(&this->globalClockingMap);
  ska::
  flat_hash_map<const_slang::ast::Scope_*,_const_slang::ast::Expression_*,_slang::Hasher<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>_>_>
  ::flat_hash_map(&this->defaultDisableMap);
  std::
  vector<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>,_std::allocator<std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>_>_>
  ::vector(&this->subroutineStorage);
  this->stdPkg = (PackageSymbol *)0x0;
  local_38[1] = 0;
  pSVar8 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind>
                     (&this->super_BumpAllocator,local_38 + 1);
  this->bitType = (Type *)pSVar8;
  local_38[0] = Logic;
  pSVar8 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind>
                     (&this->super_BumpAllocator,local_38);
  this->logicType = (Type *)pSVar8;
  local_44[2] = 1;
  pPVar9 = BumpAllocator::
           emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                     (&this->super_BumpAllocator,local_44 + 2);
  this->intType = (Type *)pPVar9;
  local_44[1] = 3;
  pPVar9 = BumpAllocator::
           emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                     (&this->super_BumpAllocator,local_44 + 1);
  this->byteType = (Type *)pPVar9;
  local_44[0] = Integer;
  pPVar9 = BumpAllocator::
           emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                     (&this->super_BumpAllocator,local_44);
  this->integerType = (Type *)pPVar9;
  local_48 = Real;
  pFVar10 = BumpAllocator::emplace<slang::ast::FloatingType,slang::ast::FloatingType::Kind>
                      (&this->super_BumpAllocator,&local_48);
  this->realType = &pFVar10->super_Type;
  regType._4_4_ = 1;
  pFVar10 = BumpAllocator::emplace<slang::ast::FloatingType,slang::ast::FloatingType::Kind>
                      (&this->super_BumpAllocator,(Kind *)((long)&regType + 4));
  this->shortRealType = &pFVar10->super_Type;
  pTVar11 = &BumpAllocator::emplace<slang::ast::StringType>(&this->super_BumpAllocator)->super_Type;
  this->stringType = pTVar11;
  pTVar11 = &BumpAllocator::emplace<slang::ast::VoidType>(&this->super_BumpAllocator)->super_Type;
  this->voidType = pTVar11;
  pTVar11 = &BumpAllocator::emplace<slang::ast::ErrorType>(&this->super_BumpAllocator)->super_Type;
  this->errorType = pTVar11;
  signedBitType._4_4_ = 2;
  local_58 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind>
                       (&this->super_BumpAllocator,(Kind *)((long)&signedBitType + 4));
  signedLogicType._4_4_ = 0;
  signedLogicType._3_1_ = 1;
  local_68 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind,bool>
                       (&this->super_BumpAllocator,(Kind *)((long)&signedLogicType + 4),
                        (bool *)((long)&signedLogicType + 3));
  signedRegType._4_4_ = 1;
  signedRegType._3_1_ = 1;
  local_78 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind,bool>
                       (&this->super_BumpAllocator,(Kind *)((long)&signedRegType + 4),
                        (bool *)((long)&signedRegType + 3));
  shortIntType._4_4_ = 2;
  shortIntType._3_1_ = 1;
  local_88 = BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind,bool>
                       (&this->super_BumpAllocator,(Kind *)((long)&shortIntType + 4),
                        (bool *)((long)&shortIntType + 3));
  longIntType._4_4_ = 0;
  local_98 = BumpAllocator::
             emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                       (&this->super_BumpAllocator,(Kind *)((long)&longIntType + 4));
  timeType._4_4_ = 2;
  local_a8 = BumpAllocator::
             emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                       (&this->super_BumpAllocator,(Kind *)((long)&timeType + 4));
  realTimeType._4_4_ = 5;
  local_b8 = BumpAllocator::
             emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind>
                       (&this->super_BumpAllocator,(Kind *)((long)&realTimeType + 4));
  chandleType._4_4_ = 2;
  local_c8 = BumpAllocator::emplace<slang::ast::FloatingType,slang::ast::FloatingType::Kind>
                       (&this->super_BumpAllocator,(Kind *)((long)&chandleType + 4));
  nullType = (NullType *)BumpAllocator::emplace<slang::ast::CHandleType>(&this->super_BumpAllocator)
  ;
  eventType = (EventType *)BumpAllocator::emplace<slang::ast::NullType>(&this->super_BumpAllocator);
  unboundedType =
       (UnboundedType *)BumpAllocator::emplace<slang::ast::EventType>(&this->super_BumpAllocator);
  typeRefType = (TypeRefType *)
                BumpAllocator::emplace<slang::ast::UnboundedType>(&this->super_BumpAllocator);
  untypedType = (UntypedType *)
                BumpAllocator::emplace<slang::ast::TypeRefType>(&this->super_BumpAllocator);
  sequenceType = (SequenceType *)
                 BumpAllocator::emplace<slang::ast::UntypedType>(&this->super_BumpAllocator);
  propertyType = (PropertyType *)
                 BumpAllocator::emplace<slang::ast::SequenceType>(&this->super_BumpAllocator);
  local_110 = &BumpAllocator::emplace<slang::ast::PropertyType>(&this->super_BumpAllocator)->
               super_Type;
  pPVar9 = local_98;
  local_128[5] = 0x192;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_128 + 5);
  *ppTVar12 = (Type *)pPVar9;
  pTVar11 = this->intType;
  local_128[4] = 0xf1;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_128 + 4);
  pPVar9 = local_a8;
  *ppTVar12 = pTVar11;
  local_128[3] = 0x10b;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_128 + 3);
  *ppTVar12 = (Type *)pPVar9;
  pTVar11 = this->byteType;
  local_128[2] = 0x37;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_128 + 2);
  *ppTVar12 = pTVar11;
  pTVar11 = this->bitType;
  local_128[1] = 0x34;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_128 + 1);
  *ppTVar12 = pTVar11;
  pTVar11 = this->logicType;
  local_128[0] = LogicType;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_128);
  pSVar8 = local_58;
  *ppTVar12 = pTVar11;
  local_12c = 5.31092e-43;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,(SyntaxKind *)&local_12c);
  *ppTVar12 = (Type *)pSVar8;
  pTVar11 = this->integerType;
  local_148[6]._0_1_ = -0xd;
  local_148[6]._1_1_ = '\0';
  local_148[6]._2_2_ = 0;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_148 + 6);
  pPVar9 = local_b8;
  *ppTVar12 = pTVar11;
  local_148[5] = 0x1ba;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_148 + 5);
  *ppTVar12 = (Type *)pPVar9;
  pTVar11 = this->realType;
  local_148[4] = 0x17a;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_148 + 4);
  pFVar10 = local_c8;
  *ppTVar12 = pTVar11;
  local_148[3] = 0x179;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_148 + 3);
  *ppTVar12 = &pFVar10->super_Type;
  pTVar11 = this->shortRealType;
  local_148[2] = 0x193;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_148 + 2);
  *ppTVar12 = pTVar11;
  pTVar11 = this->stringType;
  local_148[1] = 0x1a8;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_148 + 1);
  pNVar7 = nullType;
  *ppTVar12 = pTVar11;
  local_148[0] = CHandleType;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_148);
  pEVar6 = eventType;
  *ppTVar12 = &pNVar7->super_Type;
  local_14c = 4.40008e-43;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,(SyntaxKind *)&local_14c);
  *ppTVar12 = &pEVar6->super_Type;
  pTVar11 = this->voidType;
  local_168[6]._0_1_ = -0x12;
  local_168[6]._1_1_ = '\x01';
  local_168[6]._2_2_ = 0;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_168 + 6);
  pUVar5 = unboundedType;
  *ppTVar12 = pTVar11;
  local_168[5] = 0xb3;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_168 + 5);
  pTVar4 = typeRefType;
  *ppTVar12 = &pUVar5->super_Type;
  local_168[4] = 0x1f5;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_168 + 4);
  pUVar3 = untypedType;
  *ppTVar12 = &pTVar4->super_Type;
  local_168[3] = 0x1c6;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_168 + 3);
  pSVar2 = sequenceType;
  *ppTVar12 = &pUVar3->super_Type;
  local_168[2] = 0x1e7;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_168 + 2);
  pPVar1 = propertyType;
  *ppTVar12 = &pSVar2->super_Type;
  local_168[1] = 400;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_168 + 1);
  pTVar11 = local_110;
  *ppTVar12 = &pPVar1->super_Type;
  local_168[0] = PropertyType;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,local_168);
  *ppTVar12 = pTVar11;
  pTVar11 = this->errorType;
  local_16c = 0.0;
  ppTVar12 = ska::
             flat_hash_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::Hasher<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             ::operator[](&this->knownTypes,(SyntaxKind *)&local_16c);
  *ppTVar12 = pTVar11;
  local_17c._M_len._0_4_ = 1;
  local_190 = parsing::LexerFacts::getTokenKindText(WireKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_17c._M_len + 4),&local_17c,(Type *)&local_190);
  local_192 = WireKeyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_192);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_17c._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_1a4._M_len._0_4_ = 2;
  local_1b8 = parsing::LexerFacts::getTokenKindText(WAndKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_1a4._M_len + 4),&local_1a4,(Type *)&local_1b8);
  local_1ba = WAndKeyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_1ba);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_1a4._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_1cc._M_len._0_4_ = 3;
  local_1e0 = parsing::LexerFacts::getTokenKindText(WOrKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_1cc._M_len + 4),&local_1cc,(Type *)&local_1e0);
  local_1e2 = WOrKeyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_1e2);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_1cc._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_1f4._M_len._0_4_ = 4;
  local_208 = parsing::LexerFacts::getTokenKindText(TriKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_1f4._M_len + 4),&local_1f4,(Type *)&local_208);
  local_20a = TriKeyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_20a);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_1f4._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_21c._M_len._0_4_ = 5;
  local_230 = parsing::LexerFacts::getTokenKindText(TriAndKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_21c._M_len + 4),&local_21c,(Type *)&local_230);
  local_232 = TriAndKeyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_232);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_21c._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_244._M_len._0_4_ = 6;
  local_258 = parsing::LexerFacts::getTokenKindText(TriOrKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_244._M_len + 4),&local_244,(Type *)&local_258);
  local_25a = TriOrKeyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_25a);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_244._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_26c._M_len._0_4_ = 7;
  local_280 = parsing::LexerFacts::getTokenKindText(Tri0Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_26c._M_len + 4),&local_26c,(Type *)&local_280);
  local_282 = Tri0Keyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_282);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_26c._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_294._M_len._0_4_ = 8;
  local_2a8 = parsing::LexerFacts::getTokenKindText(Tri1Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_294._M_len + 4),&local_294,(Type *)&local_2a8);
  local_2aa = Tri1Keyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_2aa);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_294._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_2bc._M_len._0_4_ = 9;
  local_2d0 = parsing::LexerFacts::getTokenKindText(TriRegKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_2bc._M_len + 4),&local_2bc,(Type *)&local_2d0);
  local_2d2 = TriRegKeyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_2d2);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_2bc._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_2e4._M_len._0_4_ = 10;
  local_2f8 = parsing::LexerFacts::getTokenKindText(Supply0Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_2e4._M_len + 4),&local_2e4,(Type *)&local_2f8);
  local_2fa = Supply0Keyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_2fa);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_2e4._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_30c._M_len._0_4_ = 0xb;
  local_320 = parsing::LexerFacts::getTokenKindText(Supply1Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_30c._M_len + 4),&local_30c,(Type *)&local_320);
  local_322 = Supply1Keyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_322);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_30c._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_334._M_len._0_4_ = 0xc;
  local_348 = parsing::LexerFacts::getTokenKindText(UWireKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_334._M_len + 4),&local_334,(Type *)&local_348);
  local_34a = UWireKeyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_34a);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_334._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  local_35c._M_len._0_4_ = 0xd;
  local_370 = parsing::LexerFacts::getTokenKindText(InterconnectKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)((long)&local_35c._M_len + 4),&local_35c,(Type *)&local_370);
  local_372 = InterconnectKeyword;
  puVar13 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,&local_372);
  puVar14 = (unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
            ((long)&local_35c._M_len + 4);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar13,puVar14);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (puVar14);
  registerScalar.this._4_4_ = 0;
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,char_const(&)[8],slang::ast::Type&>
            ((NetKind *)&local_380,(char (*) [8])((long)&registerScalar.this + 4),(Type *)"<error>")
  ;
  registerScalar.this._2_2_ = 0;
  puVar14 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,(TokenKind *)((long)&registerScalar.this + 2));
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::operator=
            (puVar14,&local_380);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            (&local_380);
  registerScalar.this._0_2_ = 0x150;
  puVar14 = ska::
            flat_hash_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::Hasher<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
            ::operator[](&this->knownNetTypes,(TokenKind *)&registerScalar);
  pNVar15 = std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::get
                      (puVar14);
  this->wireNetType = pNVar15;
  local_390 = this;
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_390,this->bitType);
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_390,this->logicType);
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_390,local_58);
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_390,local_68);
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_390,local_78);
  Compilation(slang::Bag_const&)::$_0::operator()((__0 *)&local_390,local_88);
  TimeScaleValue::TimeScaleValue(&local_392,Nanoseconds,One);
  (this->defaultTimeScale).base = local_392;
  TimeScaleValue::TimeScaleValue(&local_394,Nanoseconds,One);
  (this->defaultTimeScale).precision = local_394;
  std::make_unique<slang::ast::RootSymbol,slang::ast::Compilation&>((Compilation *)local_3a0);
  std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::operator=
            (&this->root,
             (unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *)
             local_3a0);
  std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::~unique_ptr
            ((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *)
             local_3a0);
  builtins::registerArrayMethods(this);
  builtins::registerConversionFuncs(this);
  builtins::registerCoverageFuncs(this);
  builtins::registerEnumMethods(this);
  builtins::registerMathFuncs(this);
  builtins::registerMiscSystemFuncs(this);
  builtins::registerNonConstFuncs(this);
  builtins::registerQueryFuncs(this);
  builtins::registerStringMethods(this);
  builtins::registerSystemTasks(this);
  pPVar16 = builtins::createStdPackage(this);
  this->stdPkg = pPVar16;
  pVar17 = ska::detailv3::
           sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
           ::
           emplace<std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PackageSymbol_const*&>
                     ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
                       *)&this->packageMap,&(this->stdPkg->super_Symbol).name,&this->stdPkg);
  local_3b0 = (EntryPointer)pVar17.first.current;
  local_3a8 = pVar17.second;
  builtins::registerGateTypes(this);
  std::make_unique<slang::ast::TypeArgFormatter>();
  std::shared_ptr<slang::DiagArgFormatter>::
  shared_ptr<slang::ast::TypeArgFormatter,std::default_delete<slang::ast::TypeArgFormatter>,void>
            (&local_3c0,&local_3c8);
  DiagnosticEngine::setDefaultFormatter<slang::ast::Type_const*>(&local_3c0);
  std::shared_ptr<slang::DiagArgFormatter>::~shared_ptr(&local_3c0);
  std::unique_ptr<slang::ast::TypeArgFormatter,_std::default_delete<slang::ast::TypeArgFormatter>_>
  ::~unique_ptr(&local_3c8);
  TextDiagnosticClient::
  setDefaultSymbolPathCB<slang::ast::Compilation::Compilation(slang::Bag_const&)::__1>(&local_3c9);
  this->nextEnumSystemId = 1;
  this->nextStructSystemId = 1;
  this->nextUnionSystemId = 1;
  return;
}

Assistant:

Compilation::Compilation(const Bag& options) :
    options(options.getOrDefault<CompilationOptions>()), tempDiag({}, {}) {

    // Construct all built-in types.
    bitType = emplace<ScalarType>(ScalarType::Bit);
    logicType = emplace<ScalarType>(ScalarType::Logic);
    intType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Int);
    byteType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Byte);
    integerType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Integer);
    realType = emplace<FloatingType>(FloatingType::Real);
    shortRealType = emplace<FloatingType>(FloatingType::ShortReal);
    stringType = emplace<StringType>();
    voidType = emplace<VoidType>();
    errorType = emplace<ErrorType>();

    auto regType = emplace<ScalarType>(ScalarType::Reg);
    auto signedBitType = emplace<ScalarType>(ScalarType::Bit, true);
    auto signedLogicType = emplace<ScalarType>(ScalarType::Logic, true);
    auto signedRegType = emplace<ScalarType>(ScalarType::Reg, true);
    auto shortIntType = emplace<PredefinedIntegerType>(PredefinedIntegerType::ShortInt);
    auto longIntType = emplace<PredefinedIntegerType>(PredefinedIntegerType::LongInt);
    auto timeType = emplace<PredefinedIntegerType>(PredefinedIntegerType::Time);
    auto realTimeType = emplace<FloatingType>(FloatingType::RealTime);
    auto chandleType = emplace<CHandleType>();
    auto nullType = emplace<NullType>();
    auto eventType = emplace<EventType>();
    auto unboundedType = emplace<UnboundedType>();
    auto typeRefType = emplace<TypeRefType>();
    auto untypedType = emplace<UntypedType>();
    auto sequenceType = emplace<SequenceType>();
    auto propertyType = emplace<PropertyType>();

    // Register built-in types for lookup by syntax kind.
    knownTypes[SyntaxKind::ShortIntType] = shortIntType;
    knownTypes[SyntaxKind::IntType] = intType;
    knownTypes[SyntaxKind::LongIntType] = longIntType;
    knownTypes[SyntaxKind::ByteType] = byteType;
    knownTypes[SyntaxKind::BitType] = bitType;
    knownTypes[SyntaxKind::LogicType] = logicType;
    knownTypes[SyntaxKind::RegType] = regType;
    knownTypes[SyntaxKind::IntegerType] = integerType;
    knownTypes[SyntaxKind::TimeType] = timeType;
    knownTypes[SyntaxKind::RealType] = realType;
    knownTypes[SyntaxKind::RealTimeType] = realTimeType;
    knownTypes[SyntaxKind::ShortRealType] = shortRealType;
    knownTypes[SyntaxKind::StringType] = stringType;
    knownTypes[SyntaxKind::CHandleType] = chandleType;
    knownTypes[SyntaxKind::NullLiteralExpression] = nullType;
    knownTypes[SyntaxKind::VoidType] = voidType;
    knownTypes[SyntaxKind::EventType] = eventType;
    knownTypes[SyntaxKind::WildcardLiteralExpression] = unboundedType;
    knownTypes[SyntaxKind::TypeReference] = typeRefType;
    knownTypes[SyntaxKind::Untyped] = untypedType;
    knownTypes[SyntaxKind::SequenceType] = sequenceType;
    knownTypes[SyntaxKind::PropertyType] = propertyType;
    knownTypes[SyntaxKind::Unknown] = errorType;

#define MAKE_NETTYPE(type)                                               \
    knownNetTypes[TokenKind::type##Keyword] = std::make_unique<NetType>( \
        NetType::type, LexerFacts::getTokenKindText(TokenKind::type##Keyword), *logicType)

    MAKE_NETTYPE(Wire);
    MAKE_NETTYPE(WAnd);
    MAKE_NETTYPE(WOr);
    MAKE_NETTYPE(Tri);
    MAKE_NETTYPE(TriAnd);
    MAKE_NETTYPE(TriOr);
    MAKE_NETTYPE(Tri0);
    MAKE_NETTYPE(Tri1);
    MAKE_NETTYPE(TriReg);
    MAKE_NETTYPE(Supply0);
    MAKE_NETTYPE(Supply1);
    MAKE_NETTYPE(UWire);
    MAKE_NETTYPE(Interconnect);

    knownNetTypes[TokenKind::Unknown] = std::make_unique<NetType>(NetType::Unknown, "<error>",
                                                                  *logicType);
    wireNetType = knownNetTypes[TokenKind::WireKeyword].get();

#undef MAKE_NETTYPE

    // Scalar types are indexed by bit flags.
    auto registerScalar = [this](auto type) {
        scalarTypeTable[type->getIntegralFlags().bits() & 0x7] = type;
    };
    registerScalar(bitType);
    registerScalar(logicType);
    registerScalar(regType);
    registerScalar(signedBitType);
    registerScalar(signedLogicType);
    registerScalar(signedRegType);

    defaultTimeScale.base = {TimeUnit::Nanoseconds, TimeScaleMagnitude::One};
    defaultTimeScale.precision = {TimeUnit::Nanoseconds, TimeScaleMagnitude::One};

    root = std::make_unique<RootSymbol>(*this);

    // Register all system tasks, functions, and methods.
    builtins::registerArrayMethods(*this);
    builtins::registerConversionFuncs(*this);
    builtins::registerCoverageFuncs(*this);
    builtins::registerEnumMethods(*this);
    builtins::registerMathFuncs(*this);
    builtins::registerMiscSystemFuncs(*this);
    builtins::registerNonConstFuncs(*this);
    builtins::registerQueryFuncs(*this);
    builtins::registerStringMethods(*this);
    builtins::registerSystemTasks(*this);

    // Register the built-in std package.
    stdPkg = &builtins::createStdPackage(*this);
    packageMap.emplace(stdPkg->name, stdPkg);

    // Register the built-in gate types.
    builtins::registerGateTypes(*this);

    // Set a default handler for printing types and symbol paths, for convenience.
    DiagnosticEngine::setDefaultFormatter<const Type*>(std::make_unique<TypeArgFormatter>());
    TextDiagnosticClient::setDefaultSymbolPathCB([](const Symbol& sym) {
        std::string str;
        sym.getHierarchicalPath(str);
        return str;
    });

    // Reset systemId counters that may have been changed due to creation of types
    // in the std package.
    nextEnumSystemId = 1;
    nextStructSystemId = 1;
    nextUnionSystemId = 1;
}